

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::ShouldCompareNoPresence
          (MessageDifferencer *this,Message *message1,Reflection *reflection1,
          FieldDescriptor *field2)

{
  bool bVar1;
  bool local_59;
  byte local_49;
  Id local_48;
  byte local_31;
  bool compare_no_presence_by_address;
  FieldDescriptor *pFStack_30;
  bool compare_no_presence_by_field;
  FieldDescriptor *field2_local;
  Reflection *reflection1_local;
  Message *message1_local;
  MessageDifferencer *this_local;
  
  local_49 = 0;
  pFStack_30 = field2;
  field2_local = (FieldDescriptor *)reflection1;
  reflection1_local = (Reflection *)message1;
  message1_local = (Message *)this;
  if ((this->force_compare_no_presence_ & 1U) != 0) {
    bVar1 = FieldDescriptor::has_presence(field2);
    local_49 = 0;
    if (!bVar1) {
      bVar1 = FieldDescriptor::is_repeated(pFStack_30);
      local_49 = bVar1 ^ 0xff;
    }
  }
  local_31 = local_49 & 1;
  if (local_31 == 0) {
    bVar1 = FieldDescriptor::is_repeated(pFStack_30);
    local_59 = false;
    if (!bVar1) {
      bVar1 = FieldDescriptor::has_presence(pFStack_30);
      local_59 = false;
      if (!bVar1) {
        bVar1 = anon_unknown_5::ValidMissingField(pFStack_30);
        local_59 = false;
        if (bVar1) {
          local_48 = TextFormat::Parser::UnsetFieldsMetadata::GetUnsetFieldId
                               ((Message *)reflection1_local,pFStack_30);
          local_59 = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                     ::
                     contains<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
                               ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                                 *)&this->require_no_presence_fields_,&local_48);
        }
      }
    }
    this_local._7_1_ = local_59;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageDifferencer::ShouldCompareNoPresence(
    const Message& message1, const Reflection& reflection1,
    const FieldDescriptor* field2) const {
  const bool compare_no_presence_by_field = force_compare_no_presence_ &&
                                            !field2->has_presence() &&
                                            !field2->is_repeated();
  if (compare_no_presence_by_field) {
    return true;
  }
  const bool compare_no_presence_by_address =
      !field2->is_repeated() && !field2->has_presence() &&
      ValidMissingField(*field2) &&
      require_no_presence_fields_.ids_.contains(
          TextFormat::Parser::UnsetFieldsMetadata::GetUnsetFieldId(message1,
                                                                   *field2));
  return compare_no_presence_by_address;
}